

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageControl::mouseReleaseEvent(PageControl *this,QMouseEvent *e)

{
  MouseButton MVar1;
  int iVar2;
  uint uVar3;
  PageControlPrivate *pPVar4;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  QPoint *pQVar5;
  QPoint local_34;
  int local_2c;
  QPoint QStack_28;
  int index;
  QPoint local_20;
  QPoint pos;
  QMouseEvent *e_local;
  PageControl *this_local;
  
  pos = (QPoint)e;
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)e);
  __fd = (int)e;
  if (MVar1 == LeftButton) {
    pPVar4 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
             ::operator->(&this->d);
    if ((pPVar4->leftButtonPressed & 1U) != 0) {
      QStack_28 = QMouseEvent::pos((QMouseEvent *)pos);
      pPVar4 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      pQVar5 = &pPVar4->clickPos;
      local_20 = operator-(&stack0xffffffffffffffd8,pQVar5);
      __fd = (int)pQVar5;
      iVar2 = QPoint::manhattanLength(&local_20);
      uVar3 = FingerGeometry::touchBounce();
      in_RCX = (socklen_t *)(ulong)uVar3;
      if (iVar2 <= (int)uVar3) {
        pPVar4 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
                 ::operator->(&this->d);
        local_34 = QMouseEvent::pos((QMouseEvent *)pos);
        pQVar5 = &local_34;
        local_2c = PageControlPrivate::findButton(pPVar4,pQVar5);
        __fd = (int)pQVar5;
        if (-1 < local_2c) {
          __fd = local_2c;
          setCurrentIndex(this,local_2c);
        }
      }
    }
    pPVar4 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
             ::operator->(&this->d);
    pPVar4->leftButtonPressed = false;
    QEvent::accept((QEvent *)pos,__fd,__addr,in_RCX);
  }
  else {
    QEvent::ignore((QEvent *)pos);
  }
  return;
}

Assistant:

void
PageControl::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		if( d->leftButtonPressed )
		{
			const QPoint pos = e->pos() - d->clickPos;

			if( pos.manhattanLength() <= FingerGeometry::touchBounce() )
			{
				const int index = d->findButton( e->pos() );

				if( index >= 0 )
					setCurrentIndex( index );
			}
		}

		d->leftButtonPressed = false;

		e->accept();
	}
	else
		e->ignore();
}